

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  FILE *f_00;
  bool bVar4;
  Var VVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int x;
  ulong uVar10;
  vec<Minisat::Lit,_int> *pvVar11;
  Var max;
  vec<int,_int> map;
  uint local_5c;
  vec<int,_int> local_58;
  FILE *local_40;
  vec<Minisat::Lit,_int> *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_58.data = (int *)0x0;
  local_58.sz = 0;
  local_58.cap = 0;
  local_5c = 0;
  local_40 = (FILE *)f;
  if ((this->clauses).sz < 1) {
    iVar8 = 0;
  }
  else {
    lVar7 = 0;
    iVar8 = 0;
    do {
      uVar9 = (this->clauses).data[lVar7];
      if ((this->ca).ra.sz <= uVar9) goto LAB_0010b774;
      bVar4 = satisfied(this,(Clause *)((this->ca).ra.memory + uVar9));
      iVar8 = iVar8 + (uint)!bVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->clauses).sz);
  }
  local_38 = assumps;
  if (0 < (this->clauses).sz) {
    lVar7 = 0;
    do {
      uVar9 = (this->clauses).data[lVar7];
      if ((this->ca).ra.sz <= uVar9) goto LAB_0010b774;
      bVar4 = satisfied(this,(Clause *)((this->ca).ra.memory + uVar9));
      if (!bVar4) {
        uVar9 = (this->clauses).data[lVar7];
        if ((this->ca).ra.sz <= uVar9) goto LAB_0010b774;
        puVar3 = (this->ca).ra.memory;
        if (0x1f < puVar3[uVar9]) {
          puVar3 = puVar3 + uVar9;
          uVar10 = 0;
          do {
            uVar9 = puVar3[uVar10 + 1];
            x = (int)uVar9 >> 1;
            if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map
                .sz <= x) goto LAB_0010b755;
            bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                    .map.data[x].value;
            if ((((byte)uVar9 & 1 ^ bVar1) != l_False || (l_False & 2) != 0) &&
                (l_False & 2 & bVar1) == 0) {
              mapVar(x,&local_58,(Var *)&local_5c);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < *puVar3 >> 5);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->clauses).sz);
  }
  pvVar11 = local_38;
  uVar9 = iVar8 + local_38->sz;
  fprintf(local_40,"p cnf %d %d\n",(ulong)local_5c,(ulong)uVar9);
  if (0 < pvVar11->sz) {
    lVar7 = 0;
    do {
      uVar2 = pvVar11->data[lVar7].x;
      iVar8 = (int)uVar2 >> 1;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          iVar8) {
LAB_0010b755:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[iVar8].value;
      if (((byte)uVar2 & 1 ^ bVar1) == l_False && (l_False & 2) == 0 || (bVar1 & l_False & 2) != 0)
      {
        __assert_fail("value(assumps[i]) != l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x3d3,"void Minisat::Solver::toDimacs(FILE *, const vec<Lit> &)");
      }
      VVar5 = mapVar(iVar8,&local_58,(Var *)&local_5c);
      pcVar6 = "-";
      if ((uVar2 & 1) == 0) {
        pcVar6 = "";
      }
      fprintf(local_40,"%s%d 0\n",pcVar6,(ulong)(VVar5 + 1));
      lVar7 = lVar7 + 1;
      pvVar11 = local_38;
    } while (lVar7 < local_38->sz);
  }
  f_00 = local_40;
  if (0 < (this->clauses).sz) {
    lVar7 = 0;
    do {
      uVar2 = (this->clauses).data[lVar7];
      if ((this->ca).ra.sz <= uVar2) {
LAB_0010b774:
        __assert_fail("r < sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                      ,0x3f,
                      "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                     );
      }
      toDimacs(this,(FILE *)f_00,(Clause *)((this->ca).ra.memory + uVar2),&local_58,(Var *)&local_5c
              );
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote DIMACS with %d variables and %d clauses.\n",(ulong)local_5c,(ulong)uVar9);
  }
  if (local_58.data != (int *)0x0) {
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    free(local_58.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}